

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::keyboardSearch(QAbstractItemView *this,QString *search)

{
  byte bVar1;
  compare_eq_result_container<QList<QModelIndex>,_QModelIndex> cVar2;
  QChar QVar3;
  int iVar4;
  int iVar5;
  QFlagsStorage<Qt::MatchFlag> QVar6;
  QAbstractItemViewPrivate *pQVar7;
  qsizetype qVar8;
  QString *in_RSI;
  long in_FS_OFFSET;
  bool bVar9;
  int row;
  int newRow;
  int c;
  bool sameKey;
  qint64 keyboardInputTimeElapsed;
  bool keyboardTimeWasValid;
  bool skipRow;
  QAbstractItemViewPrivate *d;
  QModelIndexList previous;
  QModelIndex startMatch;
  QModelIndex firstMatch;
  QModelIndexList match;
  QModelIndex current;
  QModelIndex parent;
  QModelIndex start;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  enum_type in_stack_fffffffffffffd80;
  enum_type eVar10;
  enum_type in_stack_fffffffffffffd84;
  QModelIndex *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  enum_type in_stack_fffffffffffffd94;
  QAbstractItemModel *pQVar11;
  QAbstractItemModel *in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  QString *in_stack_fffffffffffffdb8;
  enum_type local_200;
  undefined1 *local_1e8;
  bool local_1d9;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  QAbstractItemModel *local_1b0;
  undefined1 local_1a8 [24];
  undefined1 *local_190;
  undefined1 *local_188;
  QAbstractItemModel *local_180;
  undefined1 local_178 [24];
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  QAbstractItemModel *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  QAbstractItemModel *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  QAbstractItemModel *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  QPersistentModelIndex local_a0 [6];
  QModelIndex local_70;
  QPersistentModelIndex local_58 [3];
  QPersistentModelIndex local_40 [3];
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = d_func((QAbstractItemView *)0x80ba6e);
  pQVar11 = pQVar7->model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_40);
  iVar4 = (**(code **)(*(long *)pQVar11 + 0x78))(pQVar11,local_40);
  bVar9 = true;
  local_200 = in_stack_fffffffffffffd84;
  if (iVar4 != 0) {
    pQVar11 = pQVar7->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_58);
    iVar4 = (**(code **)(*(long *)pQVar11 + 0x80))(pQVar11,local_58);
    bVar9 = iVar4 == 0;
    local_200 = in_stack_fffffffffffffd84;
  }
  if (!bVar9) {
    local_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_70.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    local_70.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    currentIndex((QAbstractItemView *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90))
    ;
    bVar9 = QModelIndex::isValid((QModelIndex *)CONCAT44(local_200,in_stack_fffffffffffffd80));
    if (bVar9) {
      currentIndex((QAbstractItemView *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    }
    else {
      pQVar11 = pQVar7->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_a0);
      (**(code **)(*(long *)pQVar11 + 0x60))(&local_70,pQVar11,0,0,local_a0);
    }
    local_1d9 = false;
    bVar1 = QElapsedTimer::isValid();
    local_1e8 = &DAT_aaaaaaaaaaaaaaaa;
    if ((bVar1 & 1) == 0) {
      QElapsedTimer::start();
    }
    else {
      local_1e8 = (undefined1 *)QElapsedTimer::restart();
    }
    bVar9 = QString::isEmpty((QString *)0x80bc65);
    if (((bVar9) || ((bVar1 & 1) == 0)) ||
       (iVar4 = QApplication::keyboardInputInterval(), (long)iVar4 < (long)local_1e8)) {
      QString::operator=(&pQVar7->keyboardInput,in_RSI);
      currentIndex((QAbstractItemView *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      local_1d9 = QModelIndex::isValid((QModelIndex *)CONCAT44(local_200,in_stack_fffffffffffffd80))
      ;
    }
    else {
      QString::operator+=((QString *)CONCAT44(local_200,in_stack_fffffffffffffd80),
                          (QString *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    }
    qVar8 = QString::size(&pQVar7->keyboardInput);
    if (1 < qVar8) {
      in_stack_fffffffffffffdb8 = &pQVar7->keyboardInput;
      QString::size(&pQVar7->keyboardInput);
      QVar3 = QString::at((QString *)in_stack_fffffffffffffd88,
                          CONCAT44(local_200,in_stack_fffffffffffffd80));
      iVar4 = QString::count((QChar *)&pQVar7->keyboardInput,(uint)(ushort)QVar3.ucs);
      qVar8 = QString::size(&pQVar7->keyboardInput);
      if (iVar4 == qVar8) {
        local_1d9 = true;
      }
    }
    if (local_1d9 != false) {
      local_d0 = &DAT_aaaaaaaaaaaaaaaa;
      local_c8 = &DAT_aaaaaaaaaaaaaaaa;
      local_c0 = &DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::parent((QModelIndex *)
                          CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      in_stack_fffffffffffffdb4 = QModelIndex::row(&local_70);
      iVar4 = (**(code **)(*(long *)pQVar7->model + 0x78))(pQVar7->model,&local_d0);
      if (in_stack_fffffffffffffdb4 < iVar4 + -1) {
        iVar4 = QModelIndex::row(&local_70);
        iVar4 = iVar4 + 1;
      }
      else {
        iVar4 = 0;
      }
      in_stack_fffffffffffffda0 = pQVar7->model;
      in_stack_fffffffffffffdb0 = iVar4;
      iVar5 = QModelIndex::column(&local_70);
      (**(code **)(*(long *)in_stack_fffffffffffffda0 + 0x60))
                (&local_e8,in_stack_fffffffffffffda0,iVar4,iVar5,&local_d0);
      local_70._0_8_ = local_e8;
      local_70.i = (quintptr)local_e0;
      local_70.m.ptr = local_d8;
    }
    local_100 = (undefined1 *)local_70._0_8_;
    local_f8 = (undefined1 *)local_70.i;
    local_f0 = local_70.m.ptr;
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    local_110 = &DAT_aaaaaaaaaaaaaaaa;
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QModelIndex>::QList((QList<QModelIndex> *)0x80bfa1);
    local_130 = &DAT_aaaaaaaaaaaaaaaa;
    local_128 = &DAT_aaaaaaaaaaaaaaaa;
    local_120.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x80bfdb);
    local_148 = &DAT_aaaaaaaaaaaaaaaa;
    local_140 = &DAT_aaaaaaaaaaaaaaaa;
    local_138 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x80c015);
    local_160 = &DAT_aaaaaaaaaaaaaaaa;
    local_158 = &DAT_aaaaaaaaaaaaaaaa;
    local_150 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QModelIndex>::QList((QList<QModelIndex> *)0x80c04f);
    do {
      pQVar11 = pQVar7->model;
      ::QVariant::QVariant(&local_28,(QString *)&pQVar7->keyboardInput);
      QVar6.i = (Int)Qt::operator|(local_200,in_stack_fffffffffffffd80);
      (**(code **)(*(long *)pQVar11 + 0x150))(local_178,pQVar11,&local_100,0,&local_28,1);
      QList<QModelIndex>::operator=
                ((QList<QModelIndex> *)CONCAT44(local_200,in_stack_fffffffffffffd80),
                 (QList<QModelIndex> *)CONCAT44(in_stack_fffffffffffffd7c,QVar6.i));
      QList<QModelIndex>::~QList((QList<QModelIndex> *)0x80c0f1);
      ::QVariant::~QVariant(&local_28);
      cVar2 = QList<QModelIndex>::operator==
                        ((QList<QModelIndex> *)in_stack_fffffffffffffdb8,
                         (QList<QModelIndex> *)
                         CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      if (cVar2) break;
      QList<QModelIndex>::value((QList<QModelIndex> *)in_stack_fffffffffffffda0,(qsizetype)pQVar11);
      local_130 = local_190;
      local_128 = local_188;
      local_120.ptr = local_180;
      QList<QModelIndex>::operator=
                ((QList<QModelIndex> *)CONCAT44(local_200,in_stack_fffffffffffffd80),
                 (QList<QModelIndex> *)CONCAT44(in_stack_fffffffffffffd7c,QVar6.i));
      bVar9 = QModelIndex::isValid((QModelIndex *)CONCAT44(local_200,in_stack_fffffffffffffd80));
      if (bVar9) {
        bVar9 = QAbstractItemViewPrivate::isIndexEnabled
                          ((QAbstractItemViewPrivate *)CONCAT44(local_200,in_stack_fffffffffffffd80)
                           ,(QModelIndex *)CONCAT44(in_stack_fffffffffffffd7c,QVar6.i));
        if (bVar9) {
          setCurrentIndex((QAbstractItemView *)
                          CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                          in_stack_fffffffffffffd88);
          break;
        }
        iVar4 = QModelIndex::row((QModelIndex *)&local_130);
        local_200 = iVar4 + MatchContains;
        in_stack_fffffffffffffd88 = (QModelIndex *)pQVar7->model;
        in_stack_fffffffffffffd94 = local_200;
        QModelIndex::parent((QModelIndex *)CONCAT44(local_200,in_stack_fffffffffffffd90));
        iVar4 = (**(code **)(*(long *)in_stack_fffffffffffffd88 + 0x78))
                          (in_stack_fffffffffffffd88,local_1a8);
        if (iVar4 <= (int)in_stack_fffffffffffffd94) {
          local_200 = MatchExactly;
        }
        QModelIndex::column((QModelIndex *)&local_130);
        QModelIndex::sibling
                  ((QModelIndex *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),(int)in_stack_fffffffffffffd88);
        local_100 = local_1c0;
        local_f8 = local_1b8;
        local_f0 = local_1b0;
        bVar9 = QModelIndex::isValid((QModelIndex *)CONCAT44(local_200,in_stack_fffffffffffffd80));
        if (bVar9) {
          bVar9 = ::operator==((QModelIndex *)CONCAT44(local_200,in_stack_fffffffffffffd80),
                               (QModelIndex *)CONCAT44(in_stack_fffffffffffffd7c,QVar6.i));
          if (bVar9) break;
        }
        else {
          local_148 = local_130;
          local_140 = local_128;
          local_138 = local_120.ptr;
        }
      }
      bVar9 = ::operator!=((QModelIndex *)CONCAT44(local_200,in_stack_fffffffffffffd80),
                           (QModelIndex *)CONCAT44(in_stack_fffffffffffffd7c,QVar6.i));
      eVar10 = in_stack_fffffffffffffd80 & 0xffffff;
      if (bVar9) {
        bVar9 = QModelIndex::isValid
                          ((QModelIndex *)
                           (CONCAT44(local_200,in_stack_fffffffffffffd80) & 0xffffffff00ffffff));
        eVar10 = CONCAT13(bVar9,(int3)eVar10);
      }
      in_stack_fffffffffffffd80 = eVar10;
    } while ((char)(eVar10 >> 0x18) != '\0');
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x80c34e);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x80c35b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::keyboardSearch(const QString &search)
{
    Q_D(QAbstractItemView);
    if (!d->model->rowCount(d->root) || !d->model->columnCount(d->root))
        return;

    QModelIndex start = currentIndex().isValid() ? currentIndex()
                        : d->model->index(0, 0, d->root);
    bool skipRow = false;
    bool keyboardTimeWasValid = d->keyboardInputTime.isValid();
    qint64 keyboardInputTimeElapsed;
    if (keyboardTimeWasValid)
        keyboardInputTimeElapsed = d->keyboardInputTime.restart();
    else
        d->keyboardInputTime.start();
    if (search.isEmpty() || !keyboardTimeWasValid
        || keyboardInputTimeElapsed > QApplication::keyboardInputInterval()) {
        d->keyboardInput = search;
        skipRow = currentIndex().isValid(); //if it is not valid we should really start at QModelIndex(0,0)
    } else {
        d->keyboardInput += search;
    }

    // special case for searches with same key like 'aaaaa'
    bool sameKey = false;
    if (d->keyboardInput.size() > 1) {
        int c = d->keyboardInput.count(d->keyboardInput.at(d->keyboardInput.size() - 1));
        sameKey = (c == d->keyboardInput.size());
        if (sameKey)
            skipRow = true;
    }

    // skip if we are searching for the same key or a new search started
    if (skipRow) {
        QModelIndex parent = start.parent();
        int newRow = (start.row() < d->model->rowCount(parent) - 1) ? start.row() + 1 : 0;
        start = d->model->index(newRow, start.column(), parent);
    }

    // search from start with wraparound
    QModelIndex current = start;
    QModelIndexList match;
    QModelIndex firstMatch;
    QModelIndex startMatch;
    QModelIndexList previous;
    do {
        match = d->model->match(current, Qt::DisplayRole, d->keyboardInput);
        if (match == previous)
            break;
        firstMatch = match.value(0);
        previous = match;
        if (firstMatch.isValid()) {
            if (d->isIndexEnabled(firstMatch)) {
                setCurrentIndex(firstMatch);
                break;
            }
            int row = firstMatch.row() + 1;
            if (row >= d->model->rowCount(firstMatch.parent()))
                row = 0;
            current = firstMatch.sibling(row, firstMatch.column());

            //avoid infinite loop if all the matching items are disabled.
            if (!startMatch.isValid())
                startMatch = firstMatch;
            else if (startMatch == firstMatch)
                break;
        }
    } while (current != start && firstMatch.isValid());
}